

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

SESSION_HANDLE
session_create_from_endpoint
          (CONNECTION_HANDLE connection,ENDPOINT_HANDLE endpoint,ON_LINK_ATTACHED on_link_attached,
          void *callback_context)

{
  SESSION_INSTANCE *local_30;
  SESSION_INSTANCE *result;
  void *callback_context_local;
  ON_LINK_ATTACHED on_link_attached_local;
  ENDPOINT_HANDLE endpoint_local;
  CONNECTION_HANDLE connection_local;
  
  if (endpoint == (ENDPOINT_HANDLE)0x0) {
    local_30 = (SESSION_INSTANCE *)0x0;
  }
  else {
    local_30 = (SESSION_INSTANCE *)calloc(1,0x70);
    if (local_30 != (SESSION_INSTANCE *)0x0) {
      local_30->connection = connection;
      local_30->link_endpoints = (LINK_ENDPOINT_INSTANCE **)0x0;
      local_30->link_endpoint_count = 0;
      local_30->handle_max = 0xffffffff;
      local_30->next_outgoing_id = 0;
      local_30->desired_incoming_window = 1;
      local_30->incoming_window = 1;
      local_30->outgoing_window = 1;
      local_30->handle_max = 0xffffffff;
      local_30->remote_incoming_window = 0;
      local_30->remote_outgoing_window = 0;
      local_30->previous_session_state = SESSION_STATE_UNMAPPED;
      local_30->field_0x68 = local_30->field_0x68 & 0xfe;
      local_30->session_state = SESSION_STATE_UNMAPPED;
      local_30->on_link_attached = on_link_attached;
      local_30->on_link_attached_callback_context = callback_context;
      local_30->endpoint = endpoint;
      session_set_state(local_30,SESSION_STATE_UNMAPPED);
    }
  }
  return local_30;
}

Assistant:

SESSION_HANDLE session_create_from_endpoint(CONNECTION_HANDLE connection, ENDPOINT_HANDLE endpoint, ON_LINK_ATTACHED on_link_attached, void* callback_context)
{
    SESSION_INSTANCE* result;

    if (endpoint == NULL)
    {
        result = NULL;
    }
    else
    {
        result = (SESSION_INSTANCE*)calloc(1, sizeof(SESSION_INSTANCE));
        if (result != NULL)
        {
            result->connection = connection;
            result->link_endpoints = NULL;
            result->link_endpoint_count = 0;
            result->handle_max = 4294967295u;

            result->next_outgoing_id = 0;

            result->desired_incoming_window = 1;
            result->incoming_window = 1;
            result->outgoing_window = 1;
            result->handle_max = 4294967295u;
            result->remote_incoming_window = 0;
            result->remote_outgoing_window = 0;
            result->previous_session_state = SESSION_STATE_UNMAPPED;
            result->is_underlying_connection_open = UNDERLYING_CONNECTION_NOT_OPEN;
            result->session_state = SESSION_STATE_UNMAPPED;
            result->on_link_attached = on_link_attached;
            result->on_link_attached_callback_context = callback_context;

            result->endpoint = endpoint;
            session_set_state(result, SESSION_STATE_UNMAPPED);
        }
    }

    return result;
}